

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::ModelProto_SentencePiece::MergeFrom
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *from)

{
  uint uVar1;
  LogMessage *other;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  string *value;
  InternalMetadata *this_00;
  LogFinisher local_cd;
  uint32 cached_has_bits;
  byte local_b9;
  LogMessage local_b8;
  ModelProto_SentencePiece *local_80;
  ModelProto_SentencePiece *from_local;
  ModelProto_SentencePiece *this_local;
  InternalMetadata *local_68;
  InternalMetadata *local_60;
  undefined8 local_58;
  InternalMetadata *local_50;
  string *local_48;
  InternalMetadata *local_40;
  undefined4 local_24;
  HasBits<1UL> *local_20;
  InternalMetadata *local_18;
  InternalMetadata *local_10;
  
  local_b9 = 0;
  local_80 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0xbc1);
    local_b9 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b8,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_cd,other);
  }
  if ((local_b9 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b8);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_80->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  this_local = (ModelProto_SentencePiece *)&(local_80->super_MessageLite)._internal_metadata_;
  local_68 = this_00;
  local_60 = (InternalMetadata *)this_local;
  local_10 = (InternalMetadata *)this_local;
  if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
    local_58 = 0;
    local_50 = (InternalMetadata *)this_local;
    local_40 = (InternalMetadata *)this_local;
    local_18 = (InternalMetadata *)this_local;
    if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         ((InternalMetadata *)this_local);
      local_48 = &pCVar2->unknown_fields;
    }
    else {
      local_48 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,local_48);
  }
  local_20 = &local_80->_has_bits_;
  local_24 = 0;
  uVar1 = local_20->has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      value = _internal_piece_abi_cxx11_(local_80);
      _internal_set_piece(this,value);
    }
    if ((uVar1 & 2) != 0) {
      this->score_ = local_80->score_;
    }
    if ((uVar1 & 4) != 0) {
      this->type_ = local_80->type_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void ModelProto_SentencePiece::MergeFrom(const ModelProto_SentencePiece& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.ModelProto.SentencePiece)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_piece(from._internal_piece());
    }
    if (cached_has_bits & 0x00000002u) {
      score_ = from.score_;
    }
    if (cached_has_bits & 0x00000004u) {
      type_ = from.type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}